

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

int yaml_string_write_handler(void *data,uchar *buffer,size_t size)

{
  bool bVar1;
  yaml_emitter_t *emitter;
  size_t size_local;
  uchar *buffer_local;
  void *data_local;
  
  bVar1 = size <= (ulong)(*(long *)((long)data + 0x28) - **(long **)((long)data + 0x30));
  if (bVar1) {
    memcpy((void *)(*(long *)((long)data + 0x20) + **(long **)((long)data + 0x30)),buffer,size);
    **(long **)((long)data + 0x30) = size + **(long **)((long)data + 0x30);
  }
  else {
    memcpy((void *)(*(long *)((long)data + 0x20) + **(long **)((long)data + 0x30)),buffer,
           *(long *)((long)data + 0x28) - **(long **)((long)data + 0x30));
    **(undefined8 **)((long)data + 0x30) = *(undefined8 *)((long)data + 0x28);
  }
  data_local._4_4_ = (uint)bVar1;
  return data_local._4_4_;
}

Assistant:

static int
yaml_string_write_handler(void *data, unsigned char *buffer, size_t size)
{
  yaml_emitter_t *emitter = (yaml_emitter_t *)data;

    if (emitter->output.string.size - *emitter->output.string.size_written
            < size) {
        memcpy(emitter->output.string.buffer
                + *emitter->output.string.size_written,
                buffer,
                emitter->output.string.size
                - *emitter->output.string.size_written);
        *emitter->output.string.size_written = emitter->output.string.size;
        return 0;
    }

    memcpy(emitter->output.string.buffer
            + *emitter->output.string.size_written, buffer, size);
    *emitter->output.string.size_written += size;
    return 1;
}